

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::~IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  ~IfcStructuralSurfaceConnection
            ((IfcStructuralSurfaceConnection *)&this[-1].super_IfcStructuralConnection.field_0x48);
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}